

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QString * __thiscall
QAccessibleTextWidget::attributes
          (QAccessibleTextWidget *this,int offset,int *startOffset,int *endOffset)

{
  bool bVar1;
  MoveMode MVar2;
  int iVar3;
  VerticalAlignment VVar4;
  BrushStyle BVar5;
  undefined4 uVar6;
  Int IVar7;
  int *piVar8;
  QString *pQVar9;
  ulong uVar10;
  int *in_RCX;
  QArrayDataPointer<char16_t> *this_00;
  MoveMode in_EDX;
  long *in_RSI;
  QString *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  QLatin1StringView QVar11;
  QStringBuilder<char16_t,_QString_&> QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  VerticalAlignment alignment;
  UnderlineStyle underlineStyle;
  Style style;
  int fontSize;
  int lastFragmentIndex;
  int charCount;
  char16_t *str_10;
  char16_t *str;
  char16_t *str_9;
  char16_t *str_6;
  char16_t *str_5;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str_3;
  char16_t *str_4;
  char16_t *str_11;
  char16_t *str_7;
  char16_t *str_8;
  char16_t *str_12;
  QBrush foreground;
  QBrush background;
  QString underlineStyleValue;
  QString family;
  AttributeFormatter attrs;
  int pos;
  QTextFragment fragment;
  QTextFragment f;
  int blockEnd;
  int blockStart;
  QTextCursor cursor;
  QFont charFormatFont;
  QTextBlockFormat blockFormat;
  QTextCharFormat charFormat;
  iterator iter;
  QTextBlock block;
  undefined4 in_stack_fffffffffffff6c8;
  AlignmentFlag in_stack_fffffffffffff6cc;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffff6d0;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6dc;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  undefined4 in_stack_fffffffffffff6e8;
  undefined2 in_stack_fffffffffffff6ec;
  QChar in_stack_fffffffffffff6ee;
  AttributeFormatterRef *in_stack_fffffffffffff6f0;
  char *this_01;
  QList<QString> *in_stack_fffffffffffff6f8;
  char *local_900;
  QString *t;
  UnderlineStyle local_8c4;
  int local_858;
  MoveMode local_83c;
  QArrayDataPointer<char16_t> local_6e0 [2];
  AttributeFormatterRef local_6b0;
  QArrayDataPointer<char16_t> local_6a0 [2];
  AttributeFormatterRef local_670;
  QArrayDataPointer<char16_t> local_660 [2];
  AttributeFormatterRef local_630;
  QArrayDataPointer<char16_t> local_620 [2];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_5f0;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_5ec;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_5e8;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_5e4;
  AttributeFormatterRef local_5e0;
  QChar local_5ce;
  QChar local_5cc;
  QChar local_5ca;
  storage_type *local_5c8;
  undefined1 local_5b8 [96];
  undefined1 *local_558;
  AttributeFormatterRef local_550;
  QChar local_53e;
  QChar local_53c;
  QChar local_53a;
  storage_type *local_538;
  undefined1 local_528 [96];
  undefined1 *local_4c8;
  AttributeFormatterRef local_4c0;
  AttributeFormatterRef *local_4b0;
  storage_type *local_4a8;
  undefined1 local_498 [24];
  AttributeFormatterRef local_480;
  QArrayDataPointer<char16_t> local_470 [2];
  AttributeFormatterRef local_440;
  QArrayDataPointer<char16_t> local_430 [2];
  AttributeFormatterRef local_400;
  QDebug local_3d0;
  QArrayDataPointer<char16_t> local_3c8 [2];
  QArrayDataPointer<char16_t> local_398 [2];
  QArrayDataPointer<char16_t> local_368 [2];
  QArrayDataPointer<char16_t> local_338 [2];
  QArrayDataPointer<char16_t> local_308 [2];
  QArrayDataPointer<char16_t> local_2d8 [2];
  QArrayDataPointer<char16_t> local_2a8 [2];
  undefined1 *local_278;
  undefined1 *puStack_270;
  undefined1 *local_268;
  AttributeFormatterRef local_260;
  QLatin1StringView local_250;
  AttributeFormatterRef local_240;
  char *local_230;
  storage_type *local_228;
  undefined1 local_218 [24];
  AttributeFormatterRef local_200;
  char *local_1f0;
  storage_type *local_1e8;
  undefined1 local_1d8 [24];
  AttributeFormatterRef local_1c0;
  QChar local_1aa;
  storage_type *local_1a8;
  undefined1 local_198 [48];
  AttributeFormatterRef local_168;
  undefined2 local_154;
  undefined2 local_152;
  char16_t local_150;
  QString *local_148;
  QChar local_13c;
  QChar local_13a;
  QChar local_138;
  QChar local_136;
  QChar local_134;
  QChar local_132 [25];
  QString local_100;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  int local_d0;
  int local_cc;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  int local_a8;
  int local_a4;
  undefined1 *local_a0 [4];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 local_30 [16];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  t = in_RDI;
  local_83c = in_EDX;
  if (in_EDX == ~KeepAnchor) {
    local_83c = (**(code **)(*in_RSI + 0xe8))();
  }
  MVar2 = (**(code **)(*in_RSI + 0x118))();
  if ((local_83c == ~MoveAnchor) || (local_83c == MVar2)) {
    local_83c = MVar2 - KeepAnchor;
  }
  if (((int)local_83c < 0) || ((int)MVar2 < (int)local_83c)) {
    *in_RCX = -1;
    *in_R8 = -1;
    QString::QString((QString *)0x7e616c);
  }
  else {
    local_a0[0] = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*in_RSI + 0x158))(local_a0);
    QTextCursor::setPosition((int)local_a0,local_83c);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::block();
    iVar3 = QTextBlock::position();
    local_a4 = iVar3;
    local_a8 = QTextBlock::length();
    local_a8 = iVar3 + local_a8;
    local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    local_858 = local_a4;
    while (bVar1 = QTextBlock::iterator::atEnd((iterator *)local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::iterator::fragment();
      uVar10 = QTextFragment::contains((int)&local_b8);
      if ((uVar10 & 1) != 0) break;
      local_858 = QTextFragment::position();
      iVar3 = QTextFragment::length();
      local_858 = local_858 + iVar3;
      QTextBlock::iterator::operator++((iterator *)local_30);
    }
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_40);
    bVar1 = QTextBlock::iterator::atEnd((iterator *)local_30);
    if (bVar1) {
      QTextBlock::charFormat();
      QTextCharFormat::operator=
                ((QTextCharFormat *)in_stack_fffffffffffff6d0,
                 (QTextCharFormat *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7e6470);
      *in_RCX = local_858;
      *in_R8 = local_a8;
    }
    else {
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::iterator::fragment();
      QTextFragment::charFormat();
      QTextCharFormat::operator=
                ((QTextCharFormat *)in_stack_fffffffffffff6d0,
                 (QTextCharFormat *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7e63ba);
      local_cc = QTextFragment::position();
      piVar8 = qMax<int>(&local_cc,&local_a4);
      iVar3 = local_cc;
      *in_RCX = *piVar8;
      local_d0 = QTextFragment::length();
      local_d0 = iVar3 + local_d0;
      piVar8 = qMin<int>(&local_d0,&local_a8);
      *in_R8 = *piVar8;
    }
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockFormat();
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::font();
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_12abc41::AttributeFormatter::AttributeFormatter
              ((AttributeFormatter *)0x7e6532);
    local_100.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_100.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_100.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QFont::families();
    QString::QString((QString *)0x7e6581);
    QList<QString>::value
              (in_stack_fffffffffffff6f8,(qsizetype)in_stack_fffffffffffff6f0,
               (parameter_type)
               CONCAT26(in_stack_fffffffffffff6ee.ucs,
                        CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
    QString::~QString((QString *)0x7e65af);
    QList<QString>::~QList((QList<QString> *)0x7e65bc);
    bVar1 = QString::isEmpty((QString *)0x7e65c9);
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(local_132,L'\\');
      QVar11 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                          (size_t)in_stack_fffffffffffff6d0);
      pQVar9 = (QString *)
               QString::replace((QChar *)&local_100,(QLatin1String *)(ulong)(ushort)local_132[0].ucs
                                ,(CaseSensitivity)QVar11.m_size);
      QString::operator=(&local_100,pQVar9);
      QChar::QChar<char16_t,_true>(&local_134,L':');
      QVar11 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                          (size_t)in_stack_fffffffffffff6d0);
      pQVar9 = (QString *)
               QString::replace((QChar *)&local_100,(QLatin1String *)(ulong)(ushort)local_134.ucs,
                                (CaseSensitivity)QVar11.m_size);
      QString::operator=(&local_100,pQVar9);
      QChar::QChar<char16_t,_true>(&local_136,L',');
      QVar11 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                          (size_t)in_stack_fffffffffffff6d0);
      pQVar9 = (QString *)
               QString::replace((QChar *)&local_100,(QLatin1String *)(ulong)(ushort)local_136.ucs,
                                (CaseSensitivity)QVar11.m_size);
      QString::operator=(&local_100,pQVar9);
      QChar::QChar<char16_t,_true>(&local_138,L'=');
      QVar11 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                          (size_t)in_stack_fffffffffffff6d0);
      pQVar9 = (QString *)
               QString::replace((QChar *)&local_100,(QLatin1String *)(ulong)(ushort)local_138.ucs,
                                (CaseSensitivity)QVar11.m_size);
      QString::operator=(&local_100,pQVar9);
      QChar::QChar<char16_t,_true>(&local_13a,L';');
      QVar11 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                          (size_t)in_stack_fffffffffffff6d0);
      pQVar9 = (QString *)
               QString::replace((QChar *)&local_100,(QLatin1String *)(ulong)(ushort)local_13a.ucs,
                                (CaseSensitivity)QVar11.m_size);
      QString::operator=(&local_100,pQVar9);
      QChar::QChar<char16_t,_true>(&local_13c,L'\"');
      QVar11 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                          (size_t)in_stack_fffffffffffff6d0);
      pQVar9 = (QString *)
               QString::replace((QChar *)&local_100,(QLatin1String *)(ulong)(ushort)local_13c.ucs,
                                (CaseSensitivity)QVar11.m_size);
      QString::operator=(&local_100,pQVar9);
      local_152 = 0x22;
      QVar12 = ::operator+((char16_t *)in_stack_fffffffffffff6d0,
                           (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      local_148 = QVar12.b;
      local_150 = QVar12.a;
      local_154 = 0x22;
      ::operator+((QStringBuilder<char16_t,_QString_&> *)in_stack_fffffffffffff6d0,
                  (char16_t *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      local_168 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)in_stack_fffffffffffff6d0);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                (in_stack_fffffffffffff6f0,
                 (QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t> *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
    }
    iVar3 = QFont::pointSize();
    if (iVar3 != 0) {
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (char (*) [5])CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i));
      QVar13.m_data = local_1a8;
      QVar13.m_size = (qsizetype)local_198;
      QString::fromLatin1(QVar13);
      QChar::QChar<char16_t,_true>(&local_1aa,L' ');
      QString::arg<int,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6cc,in_stack_fffffffffffff6ee);
      local_1c0 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)in_stack_fffffffffffff6d0);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                (in_stack_fffffffffffff6f0,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e69dd);
      QString::~QString((QString *)0x7e69ea);
    }
    iVar3 = QFont::weight();
    local_1f0 = "normal";
    if (400 < iVar3) {
      local_1f0 = "bold";
    }
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (char **)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i));
    QVar14.m_data = local_1e8;
    QVar14.m_size = (qsizetype)local_1d8;
    QString::fromLatin1(QVar14);
    local_200 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                          ((AttributeFormatter *)
                           CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                           (char *)in_stack_fffffffffffff6d0);
    (anonymous_namespace)::AttributeFormatterRef::operator=
              (in_stack_fffffffffffff6f0,
               (QString *)
               CONCAT26(in_stack_fffffffffffff6ee.ucs,
                        CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
    QString::~QString((QString *)0x7e6a91);
    iVar3 = QFont::style();
    if (iVar3 == 1) {
      local_900 = "italic";
    }
    else {
      local_900 = "normal";
      if (iVar3 == 2) {
        local_900 = "oblique";
      }
    }
    local_230 = local_900;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (char **)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i));
    QVar15.m_data = local_228;
    QVar15.m_size = (qsizetype)local_218;
    QString::fromLatin1(QVar15);
    local_240 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                          ((AttributeFormatter *)
                           CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                           (char *)in_stack_fffffffffffff6d0);
    (anonymous_namespace)::AttributeFormatterRef::operator=
              (in_stack_fffffffffffff6f0,
               (QString *)
               CONCAT26(in_stack_fffffffffffff6ee.ucs,
                        CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
    QString::~QString((QString *)0x7e6b5a);
    uVar10 = QFont::strikeOut();
    if ((uVar10 & 1) == 0) {
      local_250 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i)
                             ,(size_t)in_stack_fffffffffffff6d0);
    }
    else {
      local_250 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i)
                             ,(size_t)in_stack_fffffffffffff6d0);
    }
    local_260 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                          ((AttributeFormatter *)
                           CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                           (char *)in_stack_fffffffffffff6d0);
    (anonymous_namespace)::AttributeFormatterRef::operator=
              (in_stack_fffffffffffff6f0,
               (QLatin1String *)
               CONCAT26(in_stack_fffffffffffff6ee.ucs,
                        CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
    local_8c4 = QTextCharFormat::underlineStyle((QTextCharFormat *)0x7e6bf7);
    if ((local_8c4 == NoUnderline) && (uVar10 = QFont::underline(), (uVar10 & 1) != 0)) {
      local_8c4 = SingleUnderline;
    }
    local_278 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
    local_268 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x7e6c4b);
    switch(local_8c4) {
    case NoUnderline:
      break;
    case SingleUnderline:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_2a8,(Data *)0x0,L"solid",5);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      QString::operator=((QString *)in_stack_fffffffffffff6d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QString::~QString((QString *)0x7e6cfd);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
      break;
    case DashUnderline:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_2d8,(Data *)0x0,L"dash",4);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      QString::operator=((QString *)in_stack_fffffffffffff6d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QString::~QString((QString *)0x7e6d93);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
      break;
    case DotLine:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_308,(Data *)0x0,L"dash",4);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      QString::operator=((QString *)in_stack_fffffffffffff6d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QString::~QString((QString *)0x7e6e29);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
      break;
    case DashDotLine:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_338,(Data *)0x0,L"dot-dash",8);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      QString::operator=((QString *)in_stack_fffffffffffff6d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QString::~QString((QString *)0x7e6ebf);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
      break;
    case DashDotDotLine:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_368,(Data *)0x0,L"dot-dot-dash",0xc);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      QString::operator=((QString *)in_stack_fffffffffffff6d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QString::~QString((QString *)0x7e6f55);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
      break;
    case WaveUnderline:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_398,(Data *)0x0,L"wave",4);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      QString::operator=((QString *)in_stack_fffffffffffff6d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QString::~QString((QString *)0x7e6feb);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
      break;
    case SpellCheckUnderline:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_3c8,(Data *)0x0,L"wave",4);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      QString::operator=((QString *)in_stack_fffffffffffff6d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QString::~QString((QString *)0x7e7081);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
      break;
    default:
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)
                         CONCAT26(in_stack_fffffffffffff6ee.ucs,
                                  CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)),
                         (char *)t);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc);
      QDebug::operator<<((QDebug *)
                         CONCAT26(in_stack_fffffffffffff6ee.ucs,
                                  CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)),
                         (char *)t);
      QDebug::~QDebug(&local_3d0);
    }
    bVar1 = QString::isNull((QString *)0x7e7104);
    if (!bVar1) {
      local_400 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)in_stack_fffffffffffff6d0);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                (in_stack_fffffffffffff6f0,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_430,(Data *)0x0,L"single",6);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      local_440 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)in_stack_fffffffffffff6d0);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                (in_stack_fffffffffffff6f0,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e71ed);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
    }
    iVar3 = QTextBlock::textDirection();
    if (iVar3 == 1) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_470,(Data *)0x0,L"rl",2);
      QString::QString((QString *)in_stack_fffffffffffff6d0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      local_480 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)in_stack_fffffffffffff6d0);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                (in_stack_fffffffffffff6f0,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e72b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff6d0);
    }
    VVar4 = QTextCharFormat::verticalAlignment((QTextCharFormat *)0x7e72d2);
    if (VVar4 == AlignSubScript) {
      this_01 = "sub";
    }
    else {
      this_01 = "baseline";
      if (VVar4 == AlignSuperScript) {
        this_01 = "super";
      }
    }
    local_4b0 = (AttributeFormatterRef *)this_01;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (char **)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i));
    QVar16.m_data = local_4a8;
    QVar16.m_size = (qsizetype)local_498;
    QString::fromLatin1(QVar16);
    local_4c0 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                          ((AttributeFormatter *)
                           CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                           (char *)in_stack_fffffffffffff6d0);
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)this_01,
               (QString *)
               CONCAT26(in_stack_fffffffffffff6ee.ucs,
                        CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
    QString::~QString((QString *)0x7e738e);
    local_4c8 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::background
              ((QTextFormat *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
    BVar5 = QBrush::style((QBrush *)0x7e73bf);
    if (BVar5 == SolidPattern) {
      QByteArrayView::QByteArrayView<14ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (char (*) [14])CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i));
      QVar17.m_data = local_538;
      QVar17.m_size = (qsizetype)local_528;
      QString::fromLatin1(QVar17);
      QBrush::color((QBrush *)0x7e7406);
      in_stack_fffffffffffff6e4 = QColor::red();
      QChar::QChar<char16_t,_true>(&local_53a,L' ');
      QString::arg<int,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6cc,in_stack_fffffffffffff6ee);
      QBrush::color((QBrush *)0x7e745b);
      in_stack_fffffffffffff6e8 = QColor::green();
      QChar::QChar<char16_t,_true>(&local_53c,L' ');
      QString::arg<int,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6cc,in_stack_fffffffffffff6ee);
      QBrush::color((QBrush *)0x7e74b0);
      uVar6 = QColor::blue();
      in_stack_fffffffffffff6ec = (undefined2)uVar6;
      in_stack_fffffffffffff6ee.ucs = (char16_t)((uint)uVar6 >> 0x10);
      QChar::QChar<char16_t,_true>(&local_53e,L' ');
      QString::arg<int,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6cc,in_stack_fffffffffffff6ee);
      local_550 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)in_stack_fffffffffffff6d0);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                ((AttributeFormatterRef *)this_01,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e753e);
      QString::~QString((QString *)0x7e754b);
      QString::~QString((QString *)0x7e7558);
      QString::~QString((QString *)0x7e7565);
    }
    local_558 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::foreground
              ((QTextFormat *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
    BVar5 = QBrush::style((QBrush *)0x7e7596);
    if (BVar5 == SolidPattern) {
      QByteArrayView::QByteArrayView<14ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (char (*) [14])CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i));
      QVar18.m_data = local_5c8;
      QVar18.m_size = (qsizetype)local_5b8;
      QString::fromLatin1(QVar18);
      QBrush::color((QBrush *)0x7e75dd);
      in_stack_fffffffffffff6d8.i = QColor::red();
      QChar::QChar<char16_t,_true>(&local_5ca,L' ');
      QString::arg<int,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6cc,in_stack_fffffffffffff6ee);
      QBrush::color((QBrush *)0x7e7632);
      in_stack_fffffffffffff6dc = QColor::green();
      QChar::QChar<char16_t,_true>(&local_5cc,L' ');
      QString::arg<int,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6cc,in_stack_fffffffffffff6ee);
      QBrush::color((QBrush *)0x7e7687);
      QColor::blue();
      QChar::QChar<char16_t,_true>(&local_5ce,L' ');
      QString::arg<int,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6cc,in_stack_fffffffffffff6ee);
      local_5e0 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)in_stack_fffffffffffff6d0);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                ((AttributeFormatterRef *)this_01,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e7715);
      QString::~QString((QString *)0x7e7722);
      QString::~QString((QString *)0x7e772f);
      QString::~QString((QString *)0x7e773c);
    }
    local_5e8.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QTextBlockFormat::alignment((QTextBlockFormat *)in_stack_fffffffffffff6d0);
    local_5f0.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         Qt::operator|((enum_type)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                       (enum_type)in_stack_fffffffffffff6d0);
    local_5ec.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator|
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc
                   );
    QFlags<Qt::AlignmentFlag>::operator|
              ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc);
    local_5e4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff6d0,
                    (QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffff6d8.i);
    IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5e4);
    this_00 = (QArrayDataPointer<char16_t> *)(ulong)(IVar7 - 1);
    switch(this_00) {
    case (QArrayDataPointer<char16_t> *)0x0:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_620,(Data *)0x0,L"left",4);
      QString::QString((QString *)this_00,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      local_630 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)this_00);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                ((AttributeFormatterRef *)this_01,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e788a);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      break;
    case (QArrayDataPointer<char16_t> *)0x1:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_660,(Data *)0x0,L"right",5);
      QString::QString((QString *)this_00,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      local_670 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)this_00);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                ((AttributeFormatterRef *)this_01,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e7944);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      break;
    case (QArrayDataPointer<char16_t> *)0x3:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_6a0,(Data *)0x0,L"center",6);
      QString::QString((QString *)this_00,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      local_6b0 = anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                            ((AttributeFormatter *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),
                             (char *)this_00);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                ((AttributeFormatterRef *)this_01,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e79fe);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      break;
    case (QArrayDataPointer<char16_t> *)0x7:
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_6e0,(Data *)0x0,L"justify",7);
      QString::QString((QString *)this_00,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
      ;
      anon_unknown.dwarf_12abc41::AttributeFormatter::operator[]
                ((AttributeFormatter *)
                 CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8.i),(char *)this_00);
      (anonymous_namespace)::AttributeFormatterRef::operator=
                ((AttributeFormatterRef *)this_01,
                 (QString *)
                 CONCAT26(in_stack_fffffffffffff6ee.ucs,
                          CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)));
      QString::~QString((QString *)0x7e7ab8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    }
    anon_unknown.dwarf_12abc41::AttributeFormatter::toFormatted
              ((AttributeFormatter *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
    QBrush::~QBrush((QBrush *)&local_558);
    QBrush::~QBrush((QBrush *)&local_4c8);
    QString::~QString((QString *)0x7e7afe);
    QString::~QString((QString *)0x7e7b0b);
    anon_unknown.dwarf_12abc41::AttributeFormatter::~AttributeFormatter
              ((AttributeFormatter *)0x7e7b18);
    QFont::~QFont((QFont *)&local_80);
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7e7b32);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7e7b3f);
    QTextCursor::~QTextCursor((QTextCursor *)local_a0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::attributes(int offset, int *startOffset, int *endOffset) const
{
    /* The list of attributes can be found at:
     http://linuxfoundation.org/collaborate/workgroups/accessibility/iaccessible2/textattributes
    */

    // IAccessible2 defines -1 as length and -2 as cursor position
    if (offset == -2)
        offset = cursorPosition();

    const int charCount = characterCount();

    // -1 doesn't make much sense here, but it's better to return something
    // screen readers may ask for text attributes at the cursor pos which may be equal to length
    if (offset == -1 || offset == charCount)
        offset = charCount - 1;

    if (offset < 0 || offset > charCount) {
        *startOffset = -1;
        *endOffset = -1;
        return QString();
    }


    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    QTextBlock block = cursor.block();

    int blockStart = block.position();
    int blockEnd = blockStart + block.length();

    QTextBlock::iterator iter = block.begin();
    int lastFragmentIndex = blockStart;
    while (!iter.atEnd()) {
        QTextFragment f = iter.fragment();
        if (f.contains(offset))
            break;
        lastFragmentIndex = f.position() + f.length();
        ++iter;
    }

    QTextCharFormat charFormat;
    if (!iter.atEnd()) {
        QTextFragment fragment = iter.fragment();
        charFormat = fragment.charFormat();
        int pos = fragment.position();
        // text block and fragment may overlap, use the smallest common range
        *startOffset = qMax(pos, blockStart);
        *endOffset = qMin(pos + fragment.length(), blockEnd);
    } else {
        charFormat = block.charFormat();
        *startOffset = lastFragmentIndex;
        *endOffset = blockEnd;
    }
    Q_ASSERT(*startOffset <= offset);
    Q_ASSERT(*endOffset >= offset);

    QTextBlockFormat blockFormat = cursor.blockFormat();

    const QFont charFormatFont = charFormat.font();

    AttributeFormatter attrs;
    QString family = charFormatFont.families().value(0, QString());
    if (!family.isEmpty()) {
        family = family.replace(u'\\', "\\\\"_L1);
        family = family.replace(u':', "\\:"_L1);
        family = family.replace(u',', "\\,"_L1);
        family = family.replace(u'=', "\\="_L1);
        family = family.replace(u';', "\\;"_L1);
        family = family.replace(u'\"', "\\\""_L1);
        attrs["font-family"] = u'"' + family + u'"';
    }

    int fontSize = int(charFormatFont.pointSize());
    if (fontSize)
        attrs["font-size"] = QString::fromLatin1("%1pt").arg(fontSize);

    //Different weight values are not handled
    attrs["font-weight"] = QString::fromLatin1(charFormatFont.weight() > QFont::Normal ? "bold" : "normal");

    QFont::Style style = charFormatFont.style();
    attrs["font-style"] = QString::fromLatin1((style == QFont::StyleItalic) ? "italic" : ((style == QFont::StyleOblique) ? "oblique": "normal"));

    attrs["text-line-through-type"] = charFormatFont.strikeOut() ? "single"_L1 : "none"_L1;

    QTextCharFormat::UnderlineStyle underlineStyle = charFormat.underlineStyle();
    if (underlineStyle == QTextCharFormat::NoUnderline && charFormatFont.underline()) // underline could still be set in the default font
        underlineStyle = QTextCharFormat::SingleUnderline;
    QString underlineStyleValue;
    switch (underlineStyle) {
        case QTextCharFormat::NoUnderline:
            break;
        case QTextCharFormat::SingleUnderline:
            underlineStyleValue = QStringLiteral("solid");
            break;
        case QTextCharFormat::DashUnderline:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DotLine:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DashDotLine:
            underlineStyleValue = QStringLiteral("dot-dash");
            break;
        case QTextCharFormat::DashDotDotLine:
            underlineStyleValue = QStringLiteral("dot-dot-dash");
            break;
        case QTextCharFormat::WaveUnderline:
            underlineStyleValue = QStringLiteral("wave");
            break;
        case QTextCharFormat::SpellCheckUnderline:
            underlineStyleValue = QStringLiteral("wave"); // this is not correct, but provides good approximation at least
            break;
        default:
            qWarning() << "Unknown QTextCharFormat::UnderlineStyle value " << underlineStyle << " could not be translated to IAccessible2 value";
            break;
    }
    if (!underlineStyleValue.isNull()) {
        attrs["text-underline-style"] = underlineStyleValue;
        attrs["text-underline-type"] = QStringLiteral("single"); // if underlineStyleValue is set, there is an underline, and Qt does not support other than single ones
    } // else both are "none" which is the default - no need to set them

    if (block.textDirection() == Qt::RightToLeft)
        attrs["writing-mode"] = QStringLiteral("rl");

    QTextCharFormat::VerticalAlignment alignment = charFormat.verticalAlignment();
    attrs["text-position"] = QString::fromLatin1((alignment == QTextCharFormat::AlignSubScript) ? "sub" : ((alignment == QTextCharFormat::AlignSuperScript) ? "super" : "baseline" ));

    QBrush background = charFormat.background();
    if (background.style() == Qt::SolidPattern) {
        attrs["background-color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(background.color().red()).arg(background.color().green()).arg(background.color().blue());
    }

    QBrush foreground = charFormat.foreground();
    if (foreground.style() == Qt::SolidPattern) {
        attrs["color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(foreground.color().red()).arg(foreground.color().green()).arg(foreground.color().blue());
    }

    switch (blockFormat.alignment() & (Qt::AlignLeft | Qt::AlignRight | Qt::AlignHCenter | Qt::AlignJustify)) {
    case Qt::AlignLeft:
        attrs["text-align"] = QStringLiteral("left");
        break;
    case Qt::AlignRight:
        attrs["text-align"] = QStringLiteral("right");
        break;
    case Qt::AlignHCenter:
        attrs["text-align"] = QStringLiteral("center");
        break;
    case Qt::AlignJustify:
        attrs["text-align"] = QStringLiteral("justify");
        break;
    }

    return attrs.toFormatted();
}